

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalaha.h
# Opt level: O1

void __thiscall KalahaState<(short)6>::collect_seeds(KalahaState<(short)6> *this)

{
  long lVar1;
  
  check_invariant(this);
  lVar1 = 8;
  do {
    this->player1_store = this->player1_store + *(short *)((long)this->player1_bins + lVar1 + -8);
    *(undefined2 *)((long)this->player1_bins + lVar1 + -8) = 0;
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x14);
  lVar1 = 0x14;
  do {
    this->player2_store = this->player2_store + *(short *)((long)this->player1_bins + lVar1 + -8);
    *(undefined2 *)((long)this->player1_bins + lVar1 + -8) = 0;
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x20);
  check_invariant(this);
  return;
}

Assistant:

void collect_seeds()
	{
		check_invariant();
		for (auto& seed: player1_bins) {
			player1_store += seed;
			seed = 0;
		}

		for (auto& seed: player2_bins) {
			player2_store += seed;
			seed = 0;
		}
		check_invariant();
	}